

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O3

void __thiscall
cbtAlignedObjectArray<cbtPersistentManifold_*>::
quickSortInternal<cbtPersistentManifoldSortPredicateDeterministic>
          (cbtAlignedObjectArray<cbtPersistentManifold_*> *this,
          cbtPersistentManifoldSortPredicateDeterministic *CompareFunc,int lo,int hi)

{
  cbtPersistentManifold *pcVar1;
  cbtCollisionObject *pcVar2;
  cbtPersistentManifold **ppcVar3;
  cbtPersistentManifold *pcVar4;
  cbtCollisionObject *pcVar5;
  cbtPersistentManifold *pcVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  cbtPersistentManifold *temp;
  cbtCollisionObject *rcolObj0_1;
  int iVar10;
  cbtCollisionObject *rcolObj0_5;
  int lo_00;
  ulong uVar11;
  int iVar12;
  
  uVar11 = (ulong)(uint)lo;
LAB_008b7b7d:
  lo_00 = (int)uVar11;
  pcVar1 = this->m_data[(lo_00 + hi) / 2];
  uVar8 = (ulong)(uint)hi;
LAB_008b7b99:
  pcVar2 = pcVar1->m_body0;
  ppcVar3 = this->m_data;
  uVar11 = (ulong)(int)uVar11;
  iVar7 = pcVar2->m_islandTag1;
  do {
    pcVar4 = ppcVar3[uVar11];
    pcVar5 = pcVar4->m_body0;
    iVar10 = pcVar5->m_islandTag1;
    iVar9 = iVar10;
    if (iVar10 < 0) {
      iVar9 = pcVar4->m_body1->m_islandTag1;
    }
    iVar12 = iVar7;
    if (iVar7 < 0) {
      iVar12 = pcVar1->m_body1->m_islandTag1;
    }
    if (iVar12 <= iVar9) {
      iVar9 = iVar10;
      if (iVar10 < 0) {
        iVar9 = pcVar4->m_body1->m_islandTag1;
      }
      iVar12 = iVar7;
      if (iVar7 < 0) {
        iVar12 = pcVar1->m_body1->m_islandTag1;
      }
      if ((iVar9 != iVar12) ||
         (pcVar2->m_broadphaseHandle->m_uniqueId <= pcVar5->m_broadphaseHandle->m_uniqueId)) {
        if (iVar10 < 0) {
          iVar10 = pcVar4->m_body1->m_islandTag1;
        }
        iVar9 = iVar7;
        if (iVar7 < 0) {
          iVar9 = pcVar1->m_body1->m_islandTag1;
        }
        if (((iVar10 != iVar9) ||
            (pcVar5->m_broadphaseHandle->m_uniqueId != pcVar2->m_broadphaseHandle->m_uniqueId)) ||
           (pcVar1->m_body1->m_broadphaseHandle->m_uniqueId <=
            pcVar4->m_body1->m_broadphaseHandle->m_uniqueId)) break;
      }
    }
    uVar11 = uVar11 + 1;
  } while( true );
  uVar8 = (ulong)(int)uVar8;
  do {
    pcVar6 = ppcVar3[uVar8];
    iVar10 = iVar7;
    if (iVar7 < 0) {
      iVar10 = pcVar1->m_body1->m_islandTag1;
    }
    pcVar5 = pcVar6->m_body0;
    iVar9 = pcVar5->m_islandTag1;
    iVar12 = iVar9;
    if (iVar9 < 0) {
      iVar12 = pcVar6->m_body1->m_islandTag1;
    }
    if (iVar12 <= iVar10) {
      iVar10 = iVar7;
      if (iVar7 < 0) {
        iVar10 = pcVar1->m_body1->m_islandTag1;
      }
      iVar12 = iVar9;
      if (iVar9 < 0) {
        iVar12 = pcVar6->m_body1->m_islandTag1;
      }
      if ((iVar10 != iVar12) ||
         (pcVar5->m_broadphaseHandle->m_uniqueId <= pcVar2->m_broadphaseHandle->m_uniqueId)) {
        iVar10 = iVar7;
        if (iVar7 < 0) {
          iVar10 = pcVar1->m_body1->m_islandTag1;
        }
        if (iVar9 < 0) {
          iVar9 = pcVar6->m_body1->m_islandTag1;
        }
        if (((iVar10 != iVar9) ||
            (pcVar2->m_broadphaseHandle->m_uniqueId != pcVar5->m_broadphaseHandle->m_uniqueId)) ||
           (pcVar6->m_body1->m_broadphaseHandle->m_uniqueId <=
            pcVar1->m_body1->m_broadphaseHandle->m_uniqueId)) break;
      }
    }
    uVar8 = uVar8 - 1;
  } while( true );
  if ((long)uVar11 <= (long)uVar8) {
    ppcVar3[uVar11] = pcVar6;
    uVar11 = (ulong)((int)uVar11 + 1);
    this->m_data[uVar8] = pcVar4;
    uVar8 = (ulong)((int)uVar8 - 1);
  }
  iVar7 = (int)uVar8;
  if (iVar7 < (int)uVar11) goto code_r0x008b7dd6;
  goto LAB_008b7b99;
code_r0x008b7dd6:
  if (lo_00 < iVar7) {
    quickSortInternal<cbtPersistentManifoldSortPredicateDeterministic>(this,CompareFunc,lo_00,iVar7)
    ;
  }
  if (hi <= (int)uVar11) {
    return;
  }
  goto LAB_008b7b7d;
}

Assistant:

void quickSortInternal(const L& CompareFunc, int lo, int hi)
	{
		//  lo is the lower index, hi is the upper index
		//  of the region of array a that is to be sorted
		int i = lo, j = hi;
		T x = m_data[(lo + hi) / 2];

		//  partition
		do
		{
			while (CompareFunc(m_data[i], x))
				i++;
			while (CompareFunc(x, m_data[j]))
				j--;
			if (i <= j)
			{
				swap(i, j);
				i++;
				j--;
			}
		} while (i <= j);

		//  recursion
		if (lo < j)
			quickSortInternal(CompareFunc, lo, j);
		if (i < hi)
			quickSortInternal(CompareFunc, i, hi);
	}